

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_checkstack(lua_State *L,int n)

{
  CallInfo *pCVar1;
  int iVar2;
  int inuse;
  CallInfo *ci;
  int res;
  int n_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  ci._4_4_ = n;
  _res = L;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x69,"int lua_checkstack(lua_State *, int)");
  }
  if (-1 < n) {
    if ((long)n < (long)L->stack_last - (long)L->top >> 4) {
      ci._0_4_ = 1;
    }
    else if (1000000 - n < (int)((long)L->top - (long)L->stack >> 4) + 5) {
      ci._0_4_ = 0;
    }
    else {
      iVar2 = luaD_rawrunprotected(L,growstack,(void *)((long)&ci + 4));
      ci._0_4_ = (uint)(iVar2 == 0);
    }
    if (((uint)ci != 0) && (pCVar1->top < _res->top + ci._4_4_)) {
      pCVar1->top = _res->top + ci._4_4_;
    }
    iVar2 = **(int **)&_res[-1].hookmask + -1;
    **(int **)&_res[-1].hookmask = iVar2;
    if (iVar2 == 0) {
      return (uint)ci;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x76,"int lua_checkstack(lua_State *, int)");
  }
  __assert_fail("(n >= 0) && \"negative \'n\'\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x6a,"int lua_checkstack(lua_State *, int)");
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int n) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  api_check(L, n >= 0, "negative 'n'");
  if (L->stack_last - L->top > n)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - n)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &n) == LUA_OK);
  }
  if (res && ci->top < L->top + n)
    ci->top = L->top + n;  /* adjust frame top */
  lua_unlock(L);
  return res;
}